

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O2

void __thiscall sector_t::ClosestPoint(sector_t *this,DVector2 *in,DVector2 *out)

{
  vertex_t *pvVar1;
  vertex_t *pvVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar14;
  double dVar15;
  undefined1 auVar13 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar6 = this->linecount;
  uVar5 = 0;
  if ((short)uVar6 < 1) {
    uVar6 = 0;
  }
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar8 = INFINITY;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pvVar1 = this->lines[uVar5]->v1;
    pvVar2 = this->lines[uVar5]->v2;
    dVar12 = (pvVar2->p).X;
    dVar15 = (pvVar2->p).Y;
    dVar3 = (pvVar1->p).X;
    dVar4 = (pvVar1->p).Y;
    dVar16 = dVar12 - dVar3;
    dVar17 = dVar15 - dVar4;
    dVar18 = dVar17 * dVar17 + dVar16 * dVar16;
    dVar11 = dVar3;
    dVar14 = dVar4;
    if ((((dVar18 != 0.0) || (NAN(dVar18))) &&
        (dVar18 = ((in->Y - dVar4) * dVar17 + (in->X - dVar3) * dVar16) / dVar18, 0.0 < dVar18)) &&
       (dVar11 = dVar12, dVar14 = dVar15, dVar18 < 1.0)) {
      dVar11 = dVar3 + dVar16 * dVar18;
      dVar14 = dVar4 + dVar17 * dVar18;
    }
    dVar12 = dVar11 - in->X;
    dVar15 = dVar14 - in->Y;
    dVar12 = dVar15 * dVar15 + dVar12 * dVar12;
    uVar7 = (uint)(dVar12 < dVar8);
    auVar13._0_8_ = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
    auVar13._8_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    auVar13._12_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
    dVar9 = (double)(~auVar13._0_8_ & (ulong)dVar9 | (ulong)dVar11 & auVar13._0_8_);
    dVar10 = (double)(~auVar13._8_8_ & (ulong)dVar10 | (ulong)dVar14 & auVar13._8_8_);
    if (dVar8 <= dVar12) {
      dVar12 = dVar8;
    }
    dVar8 = dVar12;
  }
  out->X = dVar9;
  out->Y = dVar10;
  return;
}

Assistant:

void sector_t::ClosestPoint(const DVector2 &in, DVector2 &out) const
{
	int i;
	double x = in.X, y = in.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;

	for (i = 0; i < linecount; ++i)
	{
		vertex_t *v1 = lines[i]->v1;
		vertex_t *v2 = lines[i]->v2;
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
		}
	}
	out = { bestx, besty };
}